

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O3

unsigned_long_long *
meshopt::hashLookup<unsigned_long_long,meshopt::EdgeHasher>
          (unsigned_long_long *table,size_t buckets,EdgeHasher *hash,unsigned_long_long *key,
          unsigned_long_long *empty)

{
  uint uVar1;
  uint uVar2;
  unsigned_long_long *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = buckets - 1;
  uVar1 = *(uint *)((long)&hash->remap + ((ulong)key >> 0x20) * 4);
  uVar2 = *(uint *)((long)&hash->remap + ((ulong)key & 0xffffffff) * 4);
  uVar4 = (uVar2 >> 0x12 ^ uVar1) * 0x5bd1e995;
  uVar6 = (uVar4 >> 0x16 ^ uVar2) * 0x5bd1e995;
  uVar8 = (ulong)(((uVar6 >> 0x11 ^ uVar4) * 0x5bd1e995 >> 0x13 ^ uVar6) * 0x5bd1e995 & (uint)uVar5)
  ;
  uVar9 = 0;
  while ((puVar3 = (unsigned_long_long *)table[uVar8], puVar3 != empty &&
         ((*(uint *)((long)&hash->remap + ((ulong)puVar3 >> 0x20) * 4) != uVar1 ||
          (*(uint *)((long)&hash->remap + ((ulong)puVar3 & 0xffffffff) * 4) != uVar2))))) {
    lVar7 = uVar8 + uVar9;
    uVar9 = uVar9 + 1;
    uVar8 = lVar7 + 1U & uVar5;
    if (uVar5 < uVar9) {
      return (unsigned_long_long *)0x0;
    }
  }
  return table + uVar8;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}